

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

Str_Ntk_t * Str_ManNormalize(Gia_Man_t *p)

{
  void *__ptr;
  Gia_Man_t *p_00;
  Vec_Wec_t *vGroups;
  Vec_Int_t *pVVar1;
  Str_Ntk_t *pSVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  p_00 = Gia_ManDupMuxes(p,5);
  vGroups = Str_ManDeriveTrees(p_00);
  Str_ManCheckOverlap(p_00,vGroups);
  pVVar1 = Str_ManCreateRoots(vGroups,p_00->nObjs);
  pSVar2 = Str_ManNormalizeInt(p_00,vGroups,pVVar1);
  Gia_ManCleanMark0(p_00);
  Gia_ManStop(p_00);
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
  }
  free(pVVar1);
  iVar3 = vGroups->nCap;
  pVVar1 = vGroups->pArray;
  if (iVar3 < 1) {
    if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_007e4976;
  }
  else {
    lVar5 = 8;
    lVar4 = 0;
    do {
      __ptr = *(void **)((long)&pVVar1->nCap + lVar5);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        pVVar1 = vGroups->pArray;
        *(undefined8 *)((long)&pVVar1->nCap + lVar5) = 0;
        iVar3 = vGroups->nCap;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < iVar3);
  }
  free(pVVar1);
LAB_007e4976:
  free(vGroups);
  return pSVar2;
}

Assistant:

Str_Ntk_t * Str_ManNormalize( Gia_Man_t * p )
{
    Str_Ntk_t * pNtk;
    Gia_Man_t * pMuxes = Gia_ManDupMuxes( p, 5 );
    Vec_Wec_t * vGroups = Str_ManDeriveTrees( pMuxes );
    Vec_Int_t * vRoots;
    Str_ManCheckOverlap( pMuxes, vGroups );
    vRoots = Str_ManCreateRoots( vGroups, Gia_ManObjNum(pMuxes) );
    pNtk = Str_ManNormalizeInt( pMuxes, vGroups, vRoots );
    Gia_ManCleanMark0( pMuxes );
    Gia_ManStop( pMuxes );
    Vec_IntFree( vRoots );
    Vec_WecFree( vGroups );
    return pNtk;
}